

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O0

int xar_finish_entry(archive_write *a)

{
  void *pvVar1;
  long lVar2;
  ssize_t sVar3;
  ssize_t w;
  size_t s;
  file_conflict *file;
  xar_conflict *xar;
  archive_write *a_local;
  
  pvVar1 = a->format_data;
  if (*(long *)((long)pvVar1 + 0x40) != 0) {
    while (*(long *)((long)pvVar1 + 0x48) != 0) {
      w = *(ulong *)((long)pvVar1 + 0x48);
      if (a->null_length < (ulong)w) {
        w = a->null_length;
      }
      sVar3 = xar_write_data(a,a->nulls,w);
      if (sVar3 < 1) {
        return (int)sVar3;
      }
      *(long *)((long)pvVar1 + 0x48) = *(long *)((long)pvVar1 + 0x48) - sVar3;
    }
    lVar2 = *(long *)((long)pvVar1 + 0x40);
    checksum_final((chksumwork_conflict *)((long)pvVar1 + 0xb0),
                   (chksumval_conflict *)(lVar2 + 0x128));
    checksum_final((chksumwork_conflict *)((long)pvVar1 + 0x98),
                   (chksumval_conflict *)(lVar2 + 0x100));
    *(undefined8 *)((long)pvVar1 + 0x40) = 0;
  }
  return 0;
}

Assistant:

static int
xar_finish_entry(struct archive_write *a)
{
	struct xar *xar;
	struct file *file;
	size_t s;
	ssize_t w;

	xar = (struct xar *)a->format_data;
	if (xar->cur_file == NULL)
		return (ARCHIVE_OK);

	while (xar->bytes_remaining > 0) {
		s = (size_t)xar->bytes_remaining;
		if (s > a->null_length)
			s = a->null_length;
		w = xar_write_data(a, a->nulls, s);
		if (w > 0)
			xar->bytes_remaining -= w;
		else
			return ((int)w);
	}
	file = xar->cur_file;
	checksum_final(&(xar->e_sumwrk), &(file->data.e_sum));
	checksum_final(&(xar->a_sumwrk), &(file->data.a_sum));
	xar->cur_file = NULL;

	return (ARCHIVE_OK);
}